

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcore.c
# Opt level: O1

int MakeDirectory(char *dirPath)

{
  byte bVar1;
  int iVar2;
  DIR *pDVar3;
  size_t sVar4;
  char *__name;
  int iVar5;
  int iVar6;
  
  iVar2 = 1;
  if ((dirPath != (char *)0x0) && (iVar2 = 1, *dirPath != '\0')) {
    pDVar3 = opendir(dirPath);
    if (pDVar3 == (DIR *)0x0) {
      sVar4 = strlen(dirPath);
      iVar2 = (int)sVar4;
      __name = (char *)calloc((long)(iVar2 + 1),1);
      memcpy(__name,dirPath,(long)(iVar2 + 1));
      if (-1 < iVar2) {
        iVar5 = 0;
        do {
          bVar1 = __name[iVar5];
          iVar6 = iVar5;
          if (bVar1 < 0x3a) {
            if (bVar1 == 0x2f) {
LAB_00176124:
              __name[iVar5] = '\0';
              pDVar3 = opendir(__name);
              if (pDVar3 == (DIR *)0x0) {
                mkdir(__name,0x1ff);
              }
              else {
                closedir(pDVar3);
              }
              __name[iVar5] = '/';
            }
            else if (bVar1 == 0) break;
          }
          else if (bVar1 == 0x3a) {
            iVar6 = iVar5 + 1;
          }
          else if (bVar1 == 0x5c) goto LAB_00176124;
          iVar5 = iVar6 + 1;
        } while (iVar6 < iVar2);
      }
      pDVar3 = opendir(__name);
      if (pDVar3 == (DIR *)0x0) {
        mkdir(__name,0x1ff);
      }
      else {
        closedir(pDVar3);
      }
      free(__name);
    }
    else {
      closedir(pDVar3);
    }
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int MakeDirectory(const char *dirPath)
{
    if ((dirPath == NULL) || (dirPath[0] == '\0')) return 1; // Path is not valid
    if (DirectoryExists(dirPath)) return 0; // Path already exists (is valid)

    // Copy path string to avoid modifying original
    int len = (int)strlen(dirPath) + 1;
    char *pathcpy = (char *)RL_CALLOC(len, 1);
    memcpy(pathcpy, dirPath, len);

    // Iterate over pathcpy, create each subdirectory as needed
    for (int i = 0; (i < len) && (pathcpy[i] != '\0'); i++)
    {
        if (pathcpy[i] == ':') i++;
        else
        {
            if ((pathcpy[i] == '\\') || (pathcpy[i] == '/'))
            {
                pathcpy[i] = '\0';
                if (!DirectoryExists(pathcpy)) MKDIR(pathcpy);
                pathcpy[i] = '/';
            }
        }
    }

    // Create final directory
    if (!DirectoryExists(pathcpy)) MKDIR(pathcpy);

    RL_FREE(pathcpy);

    return 0;
}